

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O0

void __thiscall Buffer::prepend(Buffer *this,byte *data,usize size)

{
  Memory *this_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *pEVar1;
  byte *newBuffer;
  usize requiredCapacity;
  usize oldSize;
  usize size_local;
  byte *data_local;
  Buffer *this_local;
  
  if ((this->buffer == (byte *)0x0) ||
     ((ulong)((long)this->bufferStart - (long)this->buffer) < size)) {
    src = (EVP_PKEY_CTX *)(this->bufferEnd + -(long)this->bufferStart);
    pEVar1 = src + size;
    if ((this->buffer == (byte *)0x0) || ((EVP_PKEY_CTX *)this->_capacity < pEVar1)) {
      this->_capacity = (usize)pEVar1;
      this_00 = (Memory *)operator_new__((ulong)(pEVar1 + 1));
      Memory::copy(this_00,(EVP_PKEY_CTX *)data,(EVP_PKEY_CTX *)size);
      Memory::copy(this_00 + size,(EVP_PKEY_CTX *)this->bufferStart,src);
      if (this->buffer != (byte *)0x0) {
        operator_delete__(this->buffer);
      }
      this->buffer = (byte *)this_00;
      this->bufferStart = (byte *)this_00;
      this->bufferEnd = (byte *)(this_00 + (long)pEVar1);
    }
    else {
      Memory::move(this->buffer + size,this->bufferStart,(usize)src);
      Memory::copy((Memory *)this->buffer,(EVP_PKEY_CTX *)data,(EVP_PKEY_CTX *)size);
      this->bufferStart = this->buffer;
      this->bufferEnd = (byte *)(pEVar1 + (long)this->buffer);
    }
  }
  else {
    this->bufferStart = this->bufferStart + -size;
    Memory::copy((Memory *)this->bufferStart,(EVP_PKEY_CTX *)data,(EVP_PKEY_CTX *)size);
  }
  return;
}

Assistant:

void prepend(const byte* data, usize size)
  {
    if(buffer && (usize)(bufferStart - buffer) >= size)
    {
      bufferStart -= size;
      Memory::copy(bufferStart, data, size);
      return;
    }
    usize oldSize = bufferEnd - bufferStart;
    usize requiredCapacity = size + oldSize;
    if(buffer && _capacity >= requiredCapacity)
    {
      Memory::move(buffer + size, bufferStart, oldSize);
      Memory::copy(buffer, data, size);
      bufferStart = buffer;
      bufferEnd = buffer + requiredCapacity;
    }
    else
    {
        _capacity = requiredCapacity;
      byte* newBuffer = (byte*)new char[requiredCapacity + 1];
      Memory::copy(newBuffer, data, size);
      Memory::copy(newBuffer + size, bufferStart, oldSize);
      delete [] (char*)buffer;
      bufferStart = buffer = newBuffer;
      bufferEnd = newBuffer+ requiredCapacity;
    }
  }